

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O1

bool __thiscall TPZProjectEllipse::AdjustingWithEllipse(TPZProjectEllipse *this)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  TPZManVector<double,_10> NewCoeffs;
  TPZManVector<double,_10> Ratios;
  TPZManVector<double,_10> Center;
  TPZManVector<double,_10> VectorK;
  TPZManVector<double,_10> VectorJ;
  TPZManVector<double,_10> VectorI;
  TPZManVector<double,_10> local_338;
  TPZManVector<double,_10> local_2c8;
  TPZManVector<double,_10> local_258;
  TPZManVector<double,_10> local_1e8;
  TPZManVector<double,_10> local_178;
  TPZManVector<double,_10> local_108;
  TPZManVector<double,_10> local_98;
  
  iVar1 = *(int *)(this + 0x10);
  lVar5 = (long)iVar1;
  local_258.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_1e8,lVar5,(double *)&local_258);
  local_98.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_258,lVar5,(double *)&local_98);
  local_108.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_98,lVar5,(double *)&local_108);
  local_178.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_108,lVar5,(double *)&local_178);
  local_2c8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_178,lVar5,(double *)&local_2c8);
  bVar3 = LeastSquaresToGetEllipse(this);
  if (bVar3) {
    if ((iVar1 != 2) || (1e-12 <= ABS(*(double *)(*(long *)(this + 0xa0) + 0x10)))) {
      TPZManVector<double,_10>::TPZManVector(&local_2c8,0);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZProjectEllipse.cpp"
                 ,0x1af);
    }
    local_338.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_10>::TPZManVector(&local_2c8,4,(double *)&local_338);
    local_338.super_TPZVec<double>.fStore = (double *)0x0;
    local_338.super_TPZVec<double>.fNElements = 0;
    local_338.super_TPZVec<double>.fNAlloc = 0;
    local_338.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841ca0;
    uVar2 = *(ulong *)(this + 0xa8);
    if ((long)uVar2 < 0xb) {
      local_338.super_TPZVec<double>.fStore = local_338.fExtAlloc;
      local_338.super_TPZVec<double>.fNAlloc = 0;
    }
    else {
      local_338.super_TPZVec<double>.fStore =
           (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
      local_338.super_TPZVec<double>.fNAlloc = uVar2;
    }
    if (0 < (long)uVar2) {
      lVar5 = *(long *)(this + 0xa0);
      uVar4 = 0;
      do {
        local_338.super_TPZVec<double>.fStore[uVar4] = *(double *)(lVar5 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    local_338.super_TPZVec<double>.fNElements = uVar2;
    TPZManVector<double,_10>::operator=(&local_2c8,&local_338);
    TPZManVector<double,_10>::~TPZManVector(&local_338);
    bVar3 = StandardFormatForSimpleEllipse
                      (this,&local_1e8.super_TPZVec<double>,&local_258.super_TPZVec<double>);
    if (bVar3) {
      PrintingAsSimpleEquation
                (this,&local_1e8.super_TPZVec<double>,&local_258.super_TPZVec<double>,
                 (ostream *)&std::cout);
    }
    TPZManVector<double,_10>::~TPZManVector(&local_2c8);
  }
  else {
    bVar3 = false;
  }
  TPZManVector<double,_10>::~TPZManVector(&local_178);
  TPZManVector<double,_10>::~TPZManVector(&local_108);
  TPZManVector<double,_10>::~TPZManVector(&local_98);
  TPZManVector<double,_10>::~TPZManVector(&local_258);
  TPZManVector<double,_10>::~TPZManVector(&local_1e8);
  return bVar3;
}

Assistant:

bool TPZProjectEllipse::AdjustingWithEllipse() {
    
    int dim = fPoints.Cols();
	TPZManVector<REAL> Center(dim,0.);
	TPZManVector<REAL> Ratios(dim,0.);
	TPZManVector<REAL> VectorI(dim,0.);
	TPZManVector<REAL> VectorJ(dim,0.);
	TPZManVector<REAL> VectorK(dim,0.);
	// Applying least squares for these five points
	if(!LeastSquaresToGetEllipse())
		return false;
    
	// In case a12 = 0, then don't exist rotation then it is a ellipse with parallel axes to cartesian axes
	if(dim==2 && IsZero(fcoefficients[2])) {
		TPZManVector<REAL> NewCoeffs(4,0.);
        NewCoeffs = fcoefficients;
		// Making zero depending on Tolerance
		float Tol;
		ZeroTolerance(Tol);
        
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
		return true;
	}
    
	// Diagonalization of the quadratic form when Coeffs(2,0) is not null
	TPZManVector<REAL> NewCoeffs;
    DebugStop();
	//DiagonalizingQuadraticForm(NewCoeffs,std::cout);
    
	// The coefficients are multiplied by (-1/lambda2)
	if(dim==2) {
		fcoefficients[0] = -(NewCoeffs[0]/NewCoeffs[2]);
		fcoefficients[1] = -(NewCoeffs[1]/NewCoeffs[2]);
		fcoefficients[2] = -(NewCoeffs[3]/NewCoeffs[2]);
		fcoefficients[3] = -(NewCoeffs[4]/NewCoeffs[2]);
		// Getting the values of the center and ratios for the ellipse from Coeffs values
		if(!StandardFormatForSimpleEllipse(Center,Ratios))
			return false;
		PrintingAsSimpleEquation(Center,Ratios,std::cout);
	}
    
	return true;
}